

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void __thiscall Helper::GenerateRandomPermutations(Helper *this,int n_p,int n_d,int count)

{
  allocator<int> *paVar1;
  value_type vVar2;
  int iVar3;
  time_t tVar4;
  reference pvVar5;
  int local_9fc;
  int *local_9f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_9f0;
  int local_9e4;
  int *local_9e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_9d8;
  undefined1 local_9d0 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_9c0;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_9b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_9a8;
  undefined1 local_9a0 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_990;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_980;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_978;
  undefined1 local_970 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_960;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_950;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_948;
  undefined1 local_940 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_930;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_920;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_918;
  value_type local_90c;
  int local_908;
  int r_1;
  int i_1;
  int r;
  int i;
  int j;
  time_t t;
  ostream_iterator<int,_char,_std::char_traits<char>_> output_iterator_db;
  ofstream output_file_db;
  undefined1 local_6e0 [8];
  ostream_iterator<int,_char,_std::char_traits<char>_> output_iterator_pb;
  ofstream output_file_pb;
  undefined1 local_4d0 [8];
  ostream_iterator<int,_char,_std::char_traits<char>_> output_iterator_da;
  ofstream output_file_da;
  undefined1 local_2c0 [8];
  ostream_iterator<int,_char,_std::char_traits<char>_> output_iterator_pa;
  ofstream output_file_pa;
  allocator<int> local_ad;
  value_type local_ac;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> flags_d;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> pi_d;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> flags_p;
  allocator<int> local_3d;
  value_type local_3c;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> pi_p;
  int count_local;
  int n_d_local;
  int n_p_local;
  Helper *this_local;
  
  local_3c = 0;
  pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = count;
  std::allocator<int>::allocator(&local_3d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,(long)n_p,&local_3c,&local_3d);
  std::allocator<int>::~allocator(&local_3d);
  pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(long)n_p,
             (value_type *)
             ((long)&pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,(long)n_d,
             (value_type *)
             ((long)&flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  local_ac = 0;
  std::allocator<int>::allocator(&local_ad);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,(long)n_d,&local_ac,&local_ad);
  std::allocator<int>::~allocator(&local_ad);
  std::ofstream::ofstream(&output_iterator_pa._M_string,"../randoms/alice/Permutations_PA.txt",0x10)
  ;
  std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<int,_char,_std::char_traits<char>_> *)local_2c0,
             (ostream_type *)&output_iterator_pa._M_string," ");
  std::ofstream::ofstream(&output_iterator_da._M_string,"../randoms/alice/Permutations_DA.txt",0x10)
  ;
  std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<int,_char,_std::char_traits<char>_> *)local_4d0,
             (ostream_type *)&output_iterator_da._M_string," ");
  std::ofstream::ofstream(&output_iterator_pb._M_string,"../randoms/bob/Permutations_PB.txt",0x10);
  std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<int,_char,_std::char_traits<char>_> *)local_6e0,
             (ostream_type *)&output_iterator_pb._M_string," ");
  std::ofstream::ofstream(&output_iterator_db._M_string,"../randoms/bob/Permutations_DB.txt",0x10);
  std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
            ((ostream_iterator<int,_char,_std::char_traits<char>_> *)&t,
             (ostream_type *)&output_iterator_db._M_string," ");
  tVar4 = time((time_t *)&i);
  srand((uint)tVar4);
  for (r = 0; SBORROW4(r,pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ * 2) !=
              r + pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage._4_4_ * -2 < 0; r = r + 1) {
    i_1 = 0;
    r_1 = 0;
    while (i_1 < n_p) {
      iVar3 = rand();
      r_1 = iVar3 % n_p;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,(long)r_1);
      if (*pvVar5 == 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_68,(long)r_1);
        iVar3 = r_1;
        *pvVar5 = 1;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_38,(long)i_1);
        *pvVar5 = iVar3;
        i_1 = i_1 + 1;
      }
    }
    local_908 = 0;
    local_90c = 0;
    while (local_908 < n_d) {
      local_90c = rand();
      local_90c = local_90c % n_d;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_90c);
      if (*pvVar5 == 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a8,(long)local_90c);
        vVar2 = local_90c;
        *pvVar5 = 1;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_88,(long)local_908);
        *pvVar5 = vVar2;
        local_908 = local_908 + 1;
      }
    }
    if (r % 2 == 0) {
      local_918._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_38);
      local_920 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                  std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_38);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_930,(ostream_iterator<int,_char,_std::char_traits<char>_> *)local_2c0);
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_940,
                 local_918,local_920);
      local_948._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_88);
      local_950 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                  std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_88);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_960,(ostream_iterator<int,_char,_std::char_traits<char>_> *)local_4d0);
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_970,
                 local_948,local_950);
      std::ostream::operator<<
                ((ostream *)&output_iterator_pa._M_string,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<
                ((ostream *)&output_iterator_da._M_string,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      std::ostream::flush();
    }
    else {
      local_978._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_38);
      local_980 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                  std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_38);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_990,(ostream_iterator<int,_char,_std::char_traits<char>_> *)local_6e0);
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_9a0,
                 local_978,local_980);
      local_9a8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)local_88);
      local_9b0 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                  std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_88);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
                (&local_9c0,(ostream_iterator<int,_char,_std::char_traits<char>_> *)&t);
      std::
      copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_9d0,
                 local_9a8,local_9b0);
      std::ostream::operator<<
                ((ostream *)&output_iterator_pb._M_string,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<
                ((ostream *)&output_iterator_db._M_string,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      std::ostream::flush();
    }
    local_9d8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_68);
    local_9e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)local_68);
    local_9e4 = 0;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_9d8,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_9e0,
               &local_9e4);
    local_9f0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_a8);
    local_9f8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)local_a8);
    local_9fc = 0;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (local_9f0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_9f8,
               &local_9fc);
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(&output_iterator_db._M_string);
  std::ofstream::~ofstream(&output_iterator_pb._M_string);
  std::ofstream::~ofstream(&output_iterator_da._M_string);
  std::ofstream::~ofstream(&output_iterator_pa._M_string);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void Helper::GenerateRandomPermutations(int n_p, int n_d, int count)
{
    std::vector<int> pi_p(n_p, 0), flags_p(n_p, 0);
    std::vector<int> pi_d(n_d, 0), flags_d(n_d, 0);
    std::ofstream output_file_pa("../randoms/alice/Permutations_PA.txt");
    std::ostream_iterator<int> output_iterator_pa(output_file_pa, " ");
    std::ofstream output_file_da("../randoms/alice/Permutations_DA.txt");
    std::ostream_iterator<int> output_iterator_da(output_file_da, " ");
    std::ofstream output_file_pb("../randoms/bob/Permutations_PB.txt");
    std::ostream_iterator<int> output_iterator_pb(output_file_pb, " ");
    std::ofstream output_file_db("../randoms/bob/Permutations_DB.txt");
    std::ostream_iterator<int> output_iterator_db(output_file_db, " ");
    time_t t;
    srand((unsigned)time(&t));

    for (int j = 0; j < 2 * count; j++)
    {
        for (int i = 0, r = 0; i < n_p;)
        {
            r = rand() % n_p;
            if (flags_p[r] == 0)
            {
                flags_p[r] = 1;
                pi_p[i] = r;
                // std::cout << r << " ";
                i++;
            }
        }
        // std::cout << "\n";
        for (int i = 0, r = 0; i < n_d;)
        {
            r = rand() % n_d;
            if (flags_d[r] == 0)
            {
                flags_d[r] = 1;
                pi_d[i] = r;
                // std::cout << r << " ";
                i++;
            }
        }
        // std::cout << "\n";
        if (j % 2 == 0)
        {
            std::copy(pi_p.begin(), pi_p.end(), output_iterator_pa);
            std::copy(pi_d.begin(), pi_d.end(), output_iterator_da);
            output_file_pa << std::endl;
            output_file_da << std::endl;
            output_file_pa.flush();
            output_file_da.flush();
        }
        else
        {
            std::copy(pi_p.begin(), pi_p.end(), output_iterator_pb);
            std::copy(pi_d.begin(), pi_d.end(), output_iterator_db);
            output_file_pb << std::endl;
            output_file_db << std::endl;
            output_file_pb.flush();
            output_file_db.flush();
        }
        std::fill(flags_p.begin(), flags_p.end(), 0);
        std::fill(flags_d.begin(), flags_d.end(), 0);
    }
    output_file_pa.close();
    output_file_da.close();
    output_file_pb.close();
    output_file_db.close();
}